

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::DerefInc(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *self,SQObjectPtr *key,
              SQObjectPtr *incr,bool postfix,SQInteger selfidx)

{
  bool bVar1;
  undefined1 local_88 [8];
  SQObjectPtr tkey;
  undefined1 local_68 [8];
  SQObjectPtr tself;
  SQObjectPtr tmp;
  bool postfix_local;
  SQObjectPtr *incr_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQObjectPtr *target_local;
  SQInteger op_local;
  SQVM *this_local;
  
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&tself.super_SQObject._unVal);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_68,self);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_88,key);
  bVar1 = Get(this,(SQObjectPtr *)local_68,(SQObjectPtr *)local_88,
              (SQObjectPtr *)&tself.super_SQObject._unVal,0,selfidx);
  if (bVar1) {
    bVar1 = ARITH_OP(this,op,target,(SQObjectPtr *)&tself.super_SQObject._unVal,incr);
    if (bVar1) {
      bVar1 = Set(this,(SQObjectPtr *)local_68,(SQObjectPtr *)local_88,target,selfidx);
      if (bVar1) {
        if (postfix) {
          ::SQObjectPtr::operator=(target,(SQObjectPtr *)&tself.super_SQObject._unVal);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_88);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_68);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&tself.super_SQObject._unVal);
  return this_local._7_1_;
}

Assistant:

bool SQVM::DerefInc(SQInteger op,SQObjectPtr &target, SQObjectPtr &self, SQObjectPtr &key, SQObjectPtr &incr, bool postfix,SQInteger selfidx)
{
    SQObjectPtr tmp, tself = self, tkey = key;
    if (!Get(tself, tkey, tmp, 0, selfidx)) { return false; }
    _RET_ON_FAIL(ARITH_OP( op , target, tmp, incr))
    if (!Set(tself, tkey, target,selfidx)) { return false; }
    if (postfix) target = tmp;
    return true;
}